

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

void BinaryenConstSetValueI64(BinaryenExpressionRef expr,int64_t value)

{
  anon_union_16_6_1532cd5a_for_Literal_0 local_28;
  undefined8 local_18;
  
  if (expr->_id == ConstId) {
    local_18 = 3;
    local_28.i64 = value;
    wasm::Literal::operator=((Literal *)(expr + 1),(Literal *)&local_28.func);
    wasm::Literal::~Literal((Literal *)&local_28.func);
    return;
  }
  __assert_fail("expression->is<Const>()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0xac6,"void BinaryenConstSetValueI64(BinaryenExpressionRef, int64_t)");
}

Assistant:

void BinaryenConstSetValueI64(BinaryenExpressionRef expr, int64_t value) {
  auto* expression = (Expression*)expr;
  assert(expression->is<Const>());
  static_cast<Const*>(expression)->value = Literal(value);
}